

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddColor
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pColorIdx,
          list<aiColor3D,_std::allocator<aiColor3D>_> *pColors,bool pColorPerVertex)

{
  _List_node_base *p_Var1;
  list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> tcol;
  value_type local_58;
  undefined1 local_48 [16];
  size_t local_38;
  
  local_38 = 0;
  p_Var1 = (_List_node_base *)pColors;
  local_48._0_8_ = (X3DImporter *)local_48;
  local_48._8_8_ = (X3DImporter *)local_48;
  while (p_Var1 = (((_List_base<aiColor3D,_std::allocator<aiColor3D>_> *)&p_Var1->_M_next)->_M_impl)
                  ._M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)pColors) {
    local_58.b = *(float *)&p_Var1[1]._M_prev;
    local_58._0_8_ = p_Var1[1]._M_next;
    local_58.a = 1.0;
    this = (X3DImporter *)local_48;
    std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
              ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_48,&local_58);
  }
  MeshGeometry_AddColor
            (this,pMesh,pCoordIdx,pColorIdx,
             (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_48,pColorPerVertex)
  ;
  std::__cxx11::_List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::_M_clear
            ((_List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_48);
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddColor(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pColorIdx,
										const std::list<aiColor3D>& pColors, const bool pColorPerVertex) const
{
    std::list<aiColor4D> tcol;

	// create RGBA array from RGB.
    for ( std::list<aiColor3D>::const_iterator it = pColors.begin(); it != pColors.end(); ++it )
    {
        tcol.push_back( aiColor4D( ( *it ).r, ( *it ).g, ( *it ).b, 1 ) );
    }

	// call existing function for adding RGBA colors
	MeshGeometry_AddColor(pMesh, pCoordIdx, pColorIdx, tcol, pColorPerVertex);
}